

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcode.c
# Opt level: O1

void luaK_posfix(FuncState *fs,BinOpr op,expdesc *e1,expdesc *e2,int line)

{
  Instruction *pIVar1;
  anon_union_8_4_e6d17769_for_u aVar2;
  undefined4 uVar3;
  int iVar4;
  OpCode OVar5;
  int *l1;
  
  switch(op) {
  case OPR_ADD:
  case OPR_SUB:
  case OPR_MUL:
  case OPR_MOD:
  case OPR_POW:
  case OPR_DIV:
  case OPR_IDIV:
  case OPR_BAND:
  case OPR_BOR:
  case OPR_BXOR:
  case OPR_SHL:
  case OPR_SHR:
    OVar5 = op + OPR_EQ;
    goto LAB_00147fca;
  case OPR_CONCAT:
    luaK_exp2val(fs,e2);
    if ((e2->k == VRELOCABLE) && (pIVar1 = fs->f->sp->code, (pIVar1[(e2->u).info] & 0x3f) == 0x1d))
    {
      if ((e1->k == VNONRELOC) &&
         ((((uint)(e1->u).info >> 8 & 1) == 0 && ((int)(uint)fs->nactvar <= (e1->u).info)))) {
        fs->freereg = fs->freereg + 0xff;
      }
      pIVar1[(e2->u).info] = (e1->u).info << 0x17 | pIVar1[(e2->u).info] & 0x7fffff;
      e1->k = VRELOCABLE;
      (e1->u).ind = (e2->u).ind;
      return;
    }
    luaK_exp2nextreg(fs,e2);
    OVar5 = OP_CONCAT;
LAB_00147fca:
    codeexpval(fs,OVar5,e1,e2,line);
    return;
  case OPR_EQ:
  case OPR_LT:
  case OPR_LE:
    OVar5 = op + OPR_GE;
    iVar4 = 1;
    goto LAB_00147ff7;
  case OPR_NE:
  case OPR_GT:
  case OPR_GE:
    OVar5 = op + OPR_LE;
    iVar4 = 0;
LAB_00147ff7:
    codecomp(fs,OVar5,iVar4,e1,e2);
    return;
  case OPR_AND:
    luaK_dischargevars(fs,e2);
    l1 = &e2->f;
    iVar4 = e1->f;
    break;
  case OPR_OR:
    luaK_dischargevars(fs,e2);
    l1 = &e2->t;
    iVar4 = e1->t;
    break;
  default:
    goto LAB_001480c2;
  }
  luaK_concat(fs,l1,iVar4);
  iVar4 = e2->f;
  e1->t = e2->t;
  e1->f = iVar4;
  uVar3 = *(undefined4 *)&e2->field_0x4;
  aVar2 = e2->u;
  e1->k = e2->k;
  *(undefined4 *)&e1->field_0x4 = uVar3;
  e1->u = aVar2;
LAB_001480c2:
  return;
}

Assistant:

void luaK_posfix (FuncState *fs, BinOpr op,
                  expdesc *e1, expdesc *e2, int line) {
  switch (op) {
    case OPR_AND: {
      lua_assert(e1->t == NO_JUMP);  /* list must be closed */
      luaK_dischargevars(fs, e2);
      luaK_concat(fs, &e2->f, e1->f);
      *e1 = *e2;
      break;
    }
    case OPR_OR: {
      lua_assert(e1->f == NO_JUMP);  /* list must be closed */
      luaK_dischargevars(fs, e2);
      luaK_concat(fs, &e2->t, e1->t);
      *e1 = *e2;
      break;
    }
    case OPR_CONCAT: {
      luaK_exp2val(fs, e2);
      if (e2->k == VRELOCABLE && GET_OPCODE(getcode(fs, e2)) == OP_CONCAT) {
        lua_assert(e1->u.info == GETARG_B(getcode(fs, e2))-1);
        freeexp(fs, e1);
        SETARG_B(getcode(fs, e2), e1->u.info);
        e1->k = VRELOCABLE; e1->u.info = e2->u.info;
      }
      else {
        luaK_exp2nextreg(fs, e2);  /* operand must be on the 'stack' */
        codeexpval(fs, OP_CONCAT, e1, e2, line);
      }
      break;
    }
    case OPR_ADD: case OPR_SUB: case OPR_MUL: case OPR_DIV:
    case OPR_IDIV: case OPR_MOD: case OPR_POW:
    case OPR_BAND: case OPR_BOR: case OPR_BXOR:
    case OPR_SHL: case OPR_SHR: {
      codeexpval(fs, cast(OpCode, (op - OPR_ADD) + OP_ADD), e1, e2, line);
      break;
    }
    case OPR_EQ: case OPR_LT: case OPR_LE: {
      codecomp(fs, cast(OpCode, (op - OPR_EQ) + OP_EQ), 1, e1, e2);
      break;
    }
    case OPR_NE: case OPR_GT: case OPR_GE: {
      codecomp(fs, cast(OpCode, (op - OPR_NE) + OP_EQ), 0, e1, e2);
      break;
    }
    default: lua_assert(0);
  }
}